

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

Cxx20SupportLevel __thiscall
cmGeneratorTarget::HaveCxxModuleSupport(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  cmState *pcVar2;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  cmStandardLevelResolver local_68;
  cmStandardLevelResolver standardResolver;
  allocator<char> local_49;
  string local_48;
  cmState *local_28;
  cmState *state;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  state = (cmState *)config;
  config_local = (string *)this;
  pcVar2 = cmMakefile::GetState(this->Makefile);
  local_28 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"CXX",&local_49);
  bVar1 = cmState::GetLanguageEnabled(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    cmStandardLevelResolver::cmStandardLevelResolver(&local_68,this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"CXX",&local_89);
    pcVar2 = state;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"cxx_std_20",&local_b1);
    bVar1 = cmStandardLevelResolver::HaveStandardAvailable
                      (&local_68,this,&local_88,(string *)pcVar2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP",&local_d9);
      bVar1 = cmMakefile::IsOn(this_00,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local._4_4_ = Supported;
      }
      else {
        this_local._4_4_ = MissingExperimentalFlag;
      }
    }
    else {
      this_local._4_4_ = NoCxx20;
    }
  }
  else {
    this_local._4_4_ = MissingCxx;
  }
  return this_local._4_4_;
}

Assistant:

cmGeneratorTarget::Cxx20SupportLevel cmGeneratorTarget::HaveCxxModuleSupport(
  std::string const& config) const
{
  auto const* state = this->Makefile->GetState();
  if (!state->GetLanguageEnabled("CXX")) {
    return Cxx20SupportLevel::MissingCxx;
  }
  cmStandardLevelResolver standardResolver(this->Makefile);
  if (!standardResolver.HaveStandardAvailable(this, "CXX", config,
                                              "cxx_std_20")) {
    return Cxx20SupportLevel::NoCxx20;
  }
  if (!this->Makefile->IsOn("CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP")) {
    return Cxx20SupportLevel::MissingExperimentalFlag;
  }
  return Cxx20SupportLevel::Supported;
}